

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void __thiscall AActor::PostSerialize(AActor *this)

{
  FPlayerSkin *pFVar1;
  uint uVar2;
  int iVar3;
  AActor *pAVar4;
  bool bVar5;
  TFlags<ActorFlag4,_unsigned_int> local_14;
  AActor *local_10;
  AActor *this_local;
  
  this->touching_sectorlist = (msecnode_t *)0x0;
  this->touching_rendersectors = (msecnode_t *)0x0;
  local_10 = this;
  LinkToWorld(this,(FLinkContext *)0x0,false,this->Sector);
  AddToHash(this);
  if (this->player != (player_t *)0x0) {
    bVar5 = false;
    if (((playeringame[(long)(this->player[-0xa3fb].weapons.Slots + 4) / 0x2a0] & 1U) != 0) &&
       (bVar5 = false, this->player->cls != (PClassPlayerPawn *)0x0)) {
      TFlags<ActorFlag4,_unsigned_int>::operator&
                (&local_14,
                 (int)this + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
      uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_14);
      bVar5 = false;
      if (uVar2 == 0) {
        iVar3 = this->state->sprite;
        pAVar4 = GetDefaultByType((PClass *)this->player->cls);
        bVar5 = iVar3 == pAVar4->SpawnState->sprite;
      }
    }
    pFVar1 = skins;
    if (bVar5) {
      iVar3 = userinfo_t::GetSkin(&this->player->userinfo);
      this->sprite = pFVar1[iVar3].sprite;
    }
    if ((this->Speed == 0.0) && (!NAN(this->Speed))) {
      pAVar4 = GetDefault(this);
      this->Speed = pAVar4->Speed;
    }
  }
  ClearInterpolation(this);
  (*(this->super_DThinker).super_DObject._vptr_DObject[0x19])(this,0);
  return;
}

Assistant:

void AActor::PostSerialize()
{
	touching_sectorlist = nullptr;
	touching_rendersectors = nullptr;
	LinkToWorld(nullptr, false, Sector);

	AddToHash();
	if (player)
	{
		if (playeringame[player - players] &&
			player->cls != NULL &&
			!(flags4 & MF4_NOSKIN) &&
			state->sprite == GetDefaultByType(player->cls)->SpawnState->sprite)
		{ // Give player back the skin
			sprite = skins[player->userinfo.GetSkin()].sprite;
		}
		if (Speed == 0)
		{
			Speed = GetDefault()->Speed;
		}
	}
	ClearInterpolation();
	UpdateWaterLevel(false);
}